

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VulkanObjectWrappers.hpp
# Opt level: O2

void __thiscall
VulkanUtilities::VulkanObjectWrapper<VkPipeline_T_*,_(VulkanUtilities::VulkanHandleTypeId)9>::
Release(VulkanObjectWrapper<VkPipeline_T_*,_(VulkanUtilities::VulkanHandleTypeId)9> *this)

{
  VulkanLogicalDevice *this_00;
  
  this_00 = (this->m_pLogicalDevice).
            super___shared_ptr<const_VulkanUtilities::VulkanLogicalDevice,_(__gnu_cxx::_Lock_policy)2>
            ._M_ptr;
  if ((this_00 != (VulkanLogicalDevice *)0x0) && (this->m_VkObject != (VkPipeline_T *)0x0)) {
    VulkanLogicalDevice::ReleaseVulkanObject(this_00,this);
  }
  this->m_VkObject = (VkPipeline_T *)0x0;
  std::__shared_ptr<const_VulkanUtilities::VulkanLogicalDevice,_(__gnu_cxx::_Lock_policy)2>::reset
            ((__shared_ptr<const_VulkanUtilities::VulkanLogicalDevice,_(__gnu_cxx::_Lock_policy)2> *
             )this);
  return;
}

Assistant:

void Release()
    {
        // For externally managed objects, m_pLogicalDevice is null
        if (m_pLogicalDevice && m_VkObject != VK_NULL_HANDLE)
        {
            m_pLogicalDevice->ReleaseVulkanObject(std::move(*this));
        }
        m_VkObject = VK_NULL_HANDLE;
        m_pLogicalDevice.reset();
    }